

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::reserve
          (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
           *this,size_t minSize)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  unsigned_long uVar5;
  PossibleFunction *pPVar6;
  PossibleFunction *pPVar7;
  PossibleFunction *pPVar8;
  ulong local_28;
  size_t i;
  PossibleFunction *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> *this_local;
  
  if (this->numAllocated < minSize) {
    uVar5 = getAlignedSize<16,unsigned_long>(minSize);
    if (4 < uVar5) {
      pPVar6 = (PossibleFunction *)operator_new__(uVar5 << 4);
      for (local_28 = 0; local_28 < this->numActive; local_28 = local_28 + 1) {
        pPVar7 = pPVar6 + local_28;
        pPVar8 = this->items + local_28;
        pPVar7->function = pPVar8->function;
        bVar1 = pPVar8->requiresCast;
        bVar2 = pPVar8->requiresGeneric;
        bVar3 = pPVar8->functionIsNotResolved;
        uVar4 = *(undefined4 *)&pPVar8->field_0xc;
        pPVar7->isImpossible = pPVar8->isImpossible;
        pPVar7->requiresCast = bVar1;
        pPVar7->requiresGeneric = bVar2;
        pPVar7->functionIsNotResolved = bVar3;
        *(undefined4 *)&pPVar7->field_0xc = uVar4;
      }
      freeIfHeapAllocated(this);
      this->items = pPVar6;
    }
    this->numAllocated = uVar5;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }